

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerHeader.h
# Opt level: O3

void __thiscall DIS::IFFPdu::setLayerHeader(IFFPdu *this,LayerHeader *pX)

{
  uchar uVar1;
  unsigned_short uVar2;
  
  uVar1 = pX->_layerSpecificInformation;
  uVar2 = pX->_length;
  (this->_layerHeader)._layerNumber = pX->_layerNumber;
  (this->_layerHeader)._layerSpecificInformation = uVar1;
  (this->_layerHeader)._length = uVar2;
  return;
}

Assistant:

class OPENDIS7_EXPORT LayerHeader
{
protected:
  unsigned char _layerNumber; 

  /** field shall specify layer-specific information that varies by System Type (see 6.2.86) and Layer Number. */
  unsigned char _layerSpecificInformation; 

  /** This field shall specify the length in octets of the layer, including the Layer Header record */
  unsigned short _length; 


 public:
    LayerHeader();
    virtual ~LayerHeader();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned char getLayerNumber() const; 
    void setLayerNumber(unsigned char pX); 

    unsigned char getLayerSpecificInformation() const; 
    void setLayerSpecificInformation(unsigned char pX); 

    unsigned short getLength() const; 
    void setLength(unsigned short pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const LayerHeader& rhs) const;
}